

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O2

Lit __thiscall IntVarEL::createSetLit(IntVarEL *this,vec<Lit> *head)

{
  Lit q;
  IntVarEL *pIVar1;
  ulong uVar2;
  Clause *this_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  size_t __size;
  int iVar8;
  int i_1;
  int iVar9;
  vec<int> local_58;
  int v;
  Lit *local_40;
  IntVarEL *local_38;
  
  iVar9 = this->lit_min;
  iVar8 = this->lit_max;
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  std::__sort<Lit*,__gnu_cxx::__ops::_Iter_less_iter>();
  uVar2 = (ulong)head->sz;
  for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    uVar3 = head->data[uVar6].x;
    uVar7 = (int)uVar3 >> 1;
    if (*(int *)(sat.c_info.data + uVar7) < 0) {
      iVar5 = sat.c_info.data[uVar7].val;
      if ((uVar3 & 1) == 0) {
        if (iVar9 <= iVar5) {
          iVar9 = iVar5 + 1;
        }
      }
      else if (iVar5 < iVar8) {
        iVar8 = iVar5;
      }
    }
  }
  uVar6 = 0;
  local_38 = this;
  do {
    if (uVar2 <= uVar6) {
      if (iVar8 < iVar9) {
        puts("Domain wipeout??");
      }
      fflush(_stdout);
      pIVar1 = local_38;
      if (local_38->lit_min == iVar9 && local_58.sz == 0) {
        iVar5 = local_38->base_blit + iVar8 * 2 + 2;
      }
      else if (local_38->lit_max == iVar8 && local_58.sz == 0) {
        iVar5 = local_38->base_blit + iVar9 * 2 + -1;
      }
      else {
        uVar3 = SAT::getLazyVar(&sat,::ci_null);
        *(byte *)(sat.flags.data + uVar3) = *(byte *)(sat.flags.data + uVar3) & 0xfc;
        *(byte *)(sat.flags.data + uVar3) = *(byte *)(sat.flags.data + uVar3) & 0xfb;
        vec<Lit>::vec((vec<Lit> *)&v,2);
        q.x = uVar3 * 2;
        local_40[1].x = q.x;
        if (iVar9 == pIVar1->lit_min) {
          SAT::addClause(&sat,(Lit)(*local_58.data * 2 + pIVar1->base_blit),q);
          iVar9 = *local_58.data;
        }
        if (iVar8 == pIVar1->lit_max) {
          SAT::addClause(&sat,(Lit)(pIVar1->base_blit + local_58.data[local_58.sz - 1] * 2 + 1),q);
          iVar8 = local_58.data[local_58.sz - 1];
        }
        iVar5 = uVar3 * 2 + 1;
        iVar4 = iVar9 * 2;
        uVar3 = 0;
        for (; iVar9 <= iVar8; iVar9 = iVar9 + 1) {
          if (((int)uVar3 < (int)local_58.sz) && (iVar9 == local_58.data[uVar3])) {
            uVar3 = uVar3 + 1;
          }
          else {
            local_40->x = local_38->base_vlit + iVar4;
            __size = (ulong)(v - 1) * 4 + 8;
            if (v == 0) {
              __size = 8;
            }
            this_00 = (Clause *)malloc(__size);
            Clause::Clause<vec<Lit>>(this_00,(vec<Lit> *)&v,false);
            SAT::addClause(&sat,this_00,true);
          }
          iVar4 = iVar4 + 2;
        }
        free(local_40);
      }
LAB_0012fa3c:
      free(local_58.data);
      return (Lit)iVar5;
    }
    uVar3 = head->data[uVar6].x >> 1;
    if (-1 < *(int *)(sat.c_info.data + uVar3)) {
      v = sat.c_info.data[uVar3].val;
      if ((head->data[uVar6].x & 1) == 0) {
        iVar5 = v * 2 + local_38->base_vlit;
        goto LAB_0012fa3c;
      }
      if ((iVar9 <= v) && (v <= iVar8)) {
        if (v == iVar9) {
          iVar9 = iVar9 + 1;
        }
        else if (v == iVar8) {
          iVar8 = iVar8 + -1;
        }
        else {
          vec<int>::push(&local_58,&v);
          uVar2 = (ulong)head->sz;
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

Lit IntVarEL::createSetLit(vec<Lit>& head) {
	// lb, ub and holes, which together cause the conflict
	int lower_bound = lit_min;
	int upper_bound = lit_max;
	vec<int> holes;

	std::sort((Lit*)head, (Lit*)head + head.size());

	// process bounds lits first
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 0) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < upper_bound) {
				upper_bound = v;
			}
		} else {
			if (v + 1 > lower_bound) {
				lower_bound = v + 1;
			}
		}
	}

	// process val lits
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 1) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < lower_bound || v > upper_bound) {
				continue;
			}
			if (v == lower_bound) {
				lower_bound++;
				continue;
			}
			if (v == upper_bound) {
				upper_bound--;
				continue;
			}
			holes.push(v);
		} else {
			return getNELit(v);
		}
	}

	if (lower_bound > upper_bound) {
		printf("Domain wipeout??\n");
		assert(false);
	}

	//	printf("lower_bound = %d, upper_bound = %d\n", lower_bound, upper_bound);
	//	for (int i = 0; i < holes.size(); i++) printf("%d ", holes[i]); printf("\n");

	fflush(stdout);

	// Check cases where an original lit is sufficient

	if (lower_bound == lit_min && holes.size() == 0) {
		return getGELit(upper_bound + 1);
	}
	if (upper_bound == lit_max && holes.size() == 0) {
		return getLELit(lower_bound - 1);
	}

	// Create new lit that complements failure set

	Lit q = Lit(sat.getLazyVar(ci_null), true);
	sat.flags[var(q)].setUIPable(false);
	sat.flags[var(q)].setLearnable(false);

	vec<Lit> ps(2);
	ps[1] = ~q;

	if (lower_bound == lit_min) {
		// can use bounds lit for lower bound
		sat.addClause(getGELit(holes[0]), ~q);
		lower_bound = holes[0];
		//		printf("GE: %d\n", holes[0]);
	}
	if (upper_bound == lit_max) {
		// can use bounds lit for upper bound
		sat.addClause(getLELit(holes.last()), ~q);
		upper_bound = holes.last();
		//		printf("LE: %d\n", holes.last());
	}
	int j = 0;
	for (int i = lower_bound; i <= upper_bound; i++) {
		if (j < static_cast<int>(holes.size()) && i == holes[j]) {
			j++;
			continue;
		}
		ps[0] = getNELit(i);
		sat.addClause(*Clause_new(ps), true);
		//		printf("NE: %d\n", i);
	}

	//	printf("New lit = %d\n", toInt(q));

	return q;
}